

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O0

int Cudd_EqualSupNorm(DdManager *dd,DdNode *f,DdNode *g,double tolerance,int pr)

{
  int iVar1;
  DdNode *pDVar2;
  uint local_78;
  uint local_74;
  double local_70;
  uint topg;
  uint topf;
  DdNode *r;
  DdNode *gvn;
  DdNode *gv;
  DdNode *fvn;
  DdNode *fv;
  int pr_local;
  double tolerance_local;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (f == g) {
    dd_local._4_4_ = 1;
  }
  else if ((*(int *)((ulong)f & 0xfffffffffffffffe) == 0x7fffffff) &&
          (*(int *)((ulong)g & 0xfffffffffffffffe) == 0x7fffffff)) {
    if (0.0 <= (f->type).value - (g->type).value) {
      local_70 = (f->type).value - (g->type).value;
    }
    else {
      local_70 = -((f->type).value - (g->type).value);
    }
    if (tolerance <= local_70) {
      if (0 < pr) {
        fprintf((FILE *)dd->out,"Offending nodes:\n");
        fprintf((FILE *)dd->out,"f: address = %p\t value = %40.30f\n",(f->type).value,f);
        fprintf((FILE *)dd->out,"g: address = %p\t value = %40.30f\n",(g->type).value,g);
      }
      dd_local._4_4_ = 0;
    }
    else {
      dd_local._4_4_ = 1;
    }
  }
  else {
    pDVar2 = cuddCacheLookup2(dd,Cudd_EqualSupNorm,f,g);
    if (pDVar2 == (DdNode *)0x0) {
      if (f->index == 0x7fffffff) {
        local_74 = f->index;
      }
      else {
        local_74 = dd->perm[f->index];
      }
      if (g->index == 0x7fffffff) {
        local_78 = g->index;
      }
      else {
        local_78 = dd->perm[g->index];
      }
      gv = f;
      fvn = f;
      if (local_74 <= local_78) {
        fvn = (f->type).kids.T;
        gv = (f->type).kids.E;
      }
      r = g;
      gvn = g;
      if (local_78 <= local_74) {
        gvn = (g->type).kids.T;
        r = (g->type).kids.E;
      }
      iVar1 = Cudd_EqualSupNorm(dd,fvn,gvn,tolerance,pr);
      if (iVar1 == 0) {
        dd_local._4_4_ = 0;
      }
      else {
        iVar1 = Cudd_EqualSupNorm(dd,gv,r,tolerance,pr);
        if (iVar1 == 0) {
          dd_local._4_4_ = 0;
        }
        else {
          cuddCacheInsert2(dd,Cudd_EqualSupNorm,f,g,dd->one);
          dd_local._4_4_ = 1;
        }
      }
    }
    else {
      dd_local._4_4_ = 1;
    }
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_EqualSupNorm(
  DdManager * dd /* manager */,
  DdNode * f /* first ADD */,
  DdNode * g /* second ADD */,
  CUDD_VALUE_TYPE  tolerance /* maximum allowed difference */,
  int  pr /* verbosity level */)
{
    DdNode *fv, *fvn, *gv, *gvn, *r;
    unsigned int topf, topg;

    statLine(dd);
    /* Check terminal cases. */
    if (f == g) return(1);
    if (Cudd_IsConstant(f) && Cudd_IsConstant(g)) {
        if (ddEqualVal(cuddV(f),cuddV(g),tolerance)) {
            return(1);
        } else {
            if (pr>0) {
                (void) fprintf(dd->out,"Offending nodes:\n");
                (void) fprintf(dd->out,
                               "f: address = %p\t value = %40.30f\n",
                               (void *) f, cuddV(f));
                (void) fprintf(dd->out,
                               "g: address = %p\t value = %40.30f\n",
                               (void *) g, cuddV(g));
            }
            return(0);
        }
    }

    /* We only insert the result in the cache if the comparison is
    ** successful. Therefore, if we hit we return 1. */
    r = cuddCacheLookup2(dd,(DD_CTFP)Cudd_EqualSupNorm,f,g);
    if (r != NULL) {
        return(1);
    }

    /* Compute the cofactors and solve the recursive subproblems. */
    topf = cuddI(dd,f->index);
    topg = cuddI(dd,g->index);

    if (topf <= topg) {fv = cuddT(f); fvn = cuddE(f);} else {fv = fvn = f;}
    if (topg <= topf) {gv = cuddT(g); gvn = cuddE(g);} else {gv = gvn = g;}

    if (!Cudd_EqualSupNorm(dd,fv,gv,tolerance,pr)) return(0);
    if (!Cudd_EqualSupNorm(dd,fvn,gvn,tolerance,pr)) return(0);

    cuddCacheInsert2(dd,(DD_CTFP)Cudd_EqualSupNorm,f,g,DD_ONE(dd));

    return(1);

}